

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O0

FT_Error tt_sbit_decoder_load_bit_aligned
                   (TT_SBitDecoder decoder,FT_Byte *p,FT_Byte *limit,FT_Int x_pos,FT_Int y_pos,
                   FT_UInt recurse_count)

{
  byte bVar1;
  int iVar2;
  FT_Bitmap *pFVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  int local_78;
  int local_74;
  byte *pbStack_70;
  FT_Int w;
  FT_Byte *pwrite;
  FT_UShort rval;
  FT_Bitmap *bitmap;
  FT_UInt bit_width;
  FT_UInt bit_height;
  FT_Int nbits;
  FT_Int h;
  FT_Int line_bits;
  FT_Int height;
  FT_Int width;
  FT_Int pitch;
  FT_Byte *line;
  FT_Error error;
  FT_UInt recurse_count_local;
  FT_Int y_pos_local;
  FT_Int x_pos_local;
  FT_Byte *limit_local;
  FT_Byte *p_local;
  TT_SBitDecoder decoder_local;
  
  line._0_4_ = 0;
  pFVar3 = decoder->bitmap;
  iVar2 = pFVar3->pitch;
  uVar6 = (uint)decoder->metrics->width;
  uVar4 = (uint)decoder->metrics->height;
  iVar5 = uVar6 * decoder->bit_depth;
  if ((((x_pos < 0) || (pFVar3->width < x_pos + uVar6)) || (y_pos < 0)) ||
     (pFVar3->rows < y_pos + uVar4)) {
    line._0_4_ = 3;
  }
  else if (limit < p + ((int)(iVar5 * uVar4 + 7) >> 3)) {
    line._0_4_ = 3;
  }
  else if ((iVar5 != 0) && (uVar4 != 0)) {
    _width = pFVar3->buffer + (y_pos * iVar2 + (x_pos >> 3));
    uVar6 = x_pos & 7;
    pwrite._6_2_ = 0;
    bit_width = 0;
    limit_local = p;
    for (bit_height = uVar4; 0 < (int)bit_height; bit_height = bit_height - 1) {
      pbStack_70 = _width;
      local_74 = iVar5;
      if (uVar6 != 0) {
        local_78 = iVar5;
        if ((int)(8 - uVar6) <= iVar5) {
          local_78 = 8 - uVar6;
        }
        if (bit_height == uVar4) {
          pwrite._6_2_ = (ushort)*limit_local;
          bit_width = uVar6;
          limit_local = limit_local + 1;
        }
        else {
          if ((int)bit_width < local_78) {
            if (limit_local < limit) {
              pwrite._6_2_ = pwrite._6_2_ | *limit_local;
              limit_local = limit_local + 1;
            }
            iVar7 = 8 - local_78;
          }
          else {
            pwrite._6_2_ = pwrite._6_2_ >> 8;
            iVar7 = -local_78;
          }
          bit_width = iVar7 + bit_width;
        }
        pbStack_70 = _width + 1;
        *_width = *_width | (byte)((int)(uint)pwrite._6_2_ >> ((byte)bit_width & 0x1f)) &
                            (byte)((0xff << ((byte)local_78 & 0x1f) ^ 0xffffffffU) <<
                                  (('\b' - (byte)local_78) - (char)uVar6 & 0x1f));
        pwrite._6_2_ = pwrite._6_2_ << 8;
        local_74 = iVar5 - local_78;
      }
      for (; bVar8 = (byte)bit_width, 7 < local_74; local_74 = local_74 + -8) {
        bVar1 = *limit_local;
        *pbStack_70 = *pbStack_70 |
                      (byte)((int)(uint)(ushort)(pwrite._6_2_ | bVar1) >> (bVar8 & 0x1f));
        pwrite._6_2_ = (ushort)bVar1 << 8;
        pbStack_70 = pbStack_70 + 1;
        limit_local = limit_local + 1;
      }
      if (0 < local_74) {
        if ((int)bit_width < local_74) {
          if (limit_local < limit) {
            pwrite._6_2_ = pwrite._6_2_ | *limit_local;
            limit_local = limit_local + 1;
          }
          *pbStack_70 = *pbStack_70 |
                        (byte)((int)(uint)pwrite._6_2_ >> (bVar8 & 0x1f)) &
                        (byte)(0xff00 >> ((byte)local_74 & 0x1f));
          local_74 = 8 - local_74;
          pwrite._6_2_ = pwrite._6_2_ << 8;
        }
        else {
          *pbStack_70 = *pbStack_70 |
                        (byte)((int)(uint)pwrite._6_2_ >> (bVar8 & 0x1f)) &
                        (byte)(0xff00 >> ((byte)local_74 & 0x1f));
          local_74 = -local_74;
        }
        bit_width = local_74 + bit_width;
      }
      _width = _width + iVar2;
    }
  }
  return (FT_Error)line;
}

Assistant:

static FT_Error
  tt_sbit_decoder_load_bit_aligned( TT_SBitDecoder  decoder,
                                    FT_Byte*        p,
                                    FT_Byte*        limit,
                                    FT_Int          x_pos,
                                    FT_Int          y_pos,
                                    FT_UInt         recurse_count )
  {
    FT_Error    error = FT_Err_Ok;
    FT_Byte*    line;
    FT_Int      pitch, width, height, line_bits, h, nbits;
    FT_UInt     bit_height, bit_width;
    FT_Bitmap*  bitmap;
    FT_UShort   rval;

    FT_UNUSED( recurse_count );


    /* check that we can write the glyph into the bitmap */
    bitmap     = decoder->bitmap;
    bit_width  = bitmap->width;
    bit_height = bitmap->rows;
    pitch      = bitmap->pitch;
    line       = bitmap->buffer;

    width  = decoder->metrics->width;
    height = decoder->metrics->height;

    line_bits = width * decoder->bit_depth;

    if ( x_pos < 0 || (FT_UInt)( x_pos + width ) > bit_width   ||
         y_pos < 0 || (FT_UInt)( y_pos + height ) > bit_height )
    {
      FT_TRACE1(( "tt_sbit_decoder_load_bit_aligned:"
                  " invalid bitmap dimensions\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( p + ( ( line_bits * height + 7 ) >> 3 ) > limit )
    {
      FT_TRACE1(( "tt_sbit_decoder_load_bit_aligned: broken bitmap\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( !line_bits || !height )
    {
      /* nothing to do */
      goto Exit;
    }

    /* now do the blit */

    /* adjust `line' to point to the first byte of the bitmap */
    line  += y_pos * pitch + ( x_pos >> 3 );
    x_pos &= 7;

    /* the higher byte of `rval' is used as a buffer */
    rval  = 0;
    nbits = 0;

    for ( h = height; h > 0; h--, line += pitch )
    {
      FT_Byte*  pwrite = line;
      FT_Int    w      = line_bits;


      /* handle initial byte (in target bitmap) specially if necessary */
      if ( x_pos )
      {
        w = ( line_bits < 8 - x_pos ) ? line_bits : 8 - x_pos;

        if ( h == height )
        {
          rval  = *p++;
          nbits = x_pos;
        }
        else if ( nbits < w )
        {
          if ( p < limit )
            rval |= *p++;
          nbits += 8 - w;
        }
        else
        {
          rval  >>= 8;
          nbits  -= w;
        }

        *pwrite++ |= ( ( rval >> nbits ) & 0xFF ) &
                     ( ~( 0xFFU << w ) << ( 8 - w - x_pos ) );
        rval     <<= 8;

        w = line_bits - w;
      }

      /* handle medial bytes */
      for ( ; w >= 8; w -= 8 )
      {
        rval      |= *p++;
        *pwrite++ |= ( rval >> nbits ) & 0xFF;

        rval <<= 8;
      }

      /* handle final byte if necessary */
      if ( w > 0 )
      {
        if ( nbits < w )
        {
          if ( p < limit )
            rval |= *p++;
          *pwrite |= ( ( rval >> nbits ) & 0xFF ) & ( 0xFF00U >> w );
          nbits   += 8 - w;

          rval <<= 8;
        }
        else
        {
          *pwrite |= ( ( rval >> nbits ) & 0xFF ) & ( 0xFF00U >> w );
          nbits   -= w;
        }
      }
    }

  Exit:
    if ( !error )
      FT_TRACE3(( "tt_sbit_decoder_load_bit_aligned: loaded\n" ));
    return error;
  }